

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

IVal * __thiscall
vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>::doEvaluate
          (IVal *__return_storage_ptr__,Variable<tcu::Vector<float,_2>_> *this,EvalContext *ctx)

{
  double dVar1;
  undefined7 uVar2;
  IVal *pIVar3;
  
  pIVar3 = Environment::lookup<tcu::Vector<float,2>>(ctx->env,this);
  __return_storage_ptr__->m_data[0].m_hasNaN = false;
  __return_storage_ptr__->m_data[0].m_lo = INFINITY;
  __return_storage_ptr__->m_data[0].m_hi = -INFINITY;
  __return_storage_ptr__->m_data[1].m_hasNaN = false;
  __return_storage_ptr__->m_data[1].m_lo = INFINITY;
  __return_storage_ptr__->m_data[1].m_hi = -INFINITY;
  __return_storage_ptr__->m_data[0].m_hi = pIVar3->m_data[0].m_hi;
  uVar2 = *(undefined7 *)&pIVar3->m_data[0].field_0x1;
  dVar1 = pIVar3->m_data[0].m_lo;
  __return_storage_ptr__->m_data[0].m_hasNaN = pIVar3->m_data[0].m_hasNaN;
  *(undefined7 *)&__return_storage_ptr__->m_data[0].field_0x1 = uVar2;
  __return_storage_ptr__->m_data[0].m_lo = dVar1;
  __return_storage_ptr__->m_data[1].m_hi = pIVar3->m_data[1].m_hi;
  uVar2 = *(undefined7 *)&pIVar3->m_data[1].field_0x1;
  dVar1 = pIVar3->m_data[1].m_lo;
  __return_storage_ptr__->m_data[1].m_hasNaN = pIVar3->m_data[1].m_hasNaN;
  *(undefined7 *)&__return_storage_ptr__->m_data[1].field_0x1 = uVar2;
  __return_storage_ptr__->m_data[1].m_lo = dVar1;
  return __return_storage_ptr__;
}

Assistant:

IVal			doEvaluate	(const EvalContext& ctx)		const
	{
		return ctx.env.lookup<T>(*this);
	}